

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O1

void __thiscall
MyServerConnection::OnData(MyServerConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  ostringstream *poVar1;
  element_type *peVar2;
  SDKResult result;
  size_t sVar3;
  OutputWorker *pOVar4;
  char *pcVar5;
  shared_ptr<MyServerConnection> *connection;
  pointer psVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<MyServerConnection> receiver;
  shared_ptr<MyServerConnection> sender;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatusEx status;
  element_type *local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_460;
  element_type *local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_450 [2];
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  local_440;
  TonkStatusEx local_428;
  undefined1 local_3a8 [392];
  TonkStatusEx local_220;
  TonkStatusEx local_1a0;
  TonkStatusEx local_120;
  TonkStatusEx local_a0;
  
  if (bytes == 1 && channel == 0x32) {
    tonk::SDKConnection::GetStatusEx(&local_220,&this->super_SDKConnection);
    if (*data == '\0') {
      if ((int)Logger.ChannelMinLevel < 3) {
        poVar1 = (ostringstream *)(local_3a8 + 0x10);
        local_3a8._0_8_ = Logger.ChannelName;
        local_3a8._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Sender from ",0xc);
        sVar3 = strlen(local_220.Remote.NetworkString);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_220.Remote.NetworkString,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_3a8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_3a8 + 0x80));
      }
      LOCK();
      (this->IsSender)._M_base._M_i = true;
      UNLOCK();
    }
    else if (*data == '\x01') {
      if ((int)Logger.ChannelMinLevel < 3) {
        poVar1 = (ostringstream *)(local_3a8 + 0x10);
        local_3a8._0_8_ = Logger.ChannelName;
        local_3a8._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Receiver from ",0xe);
        sVar3 = strlen(local_220.Remote.NetworkString);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_220.Remote.NetworkString,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_3a8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_3a8 + 0x80));
      }
      LOCK();
      (this->IsReceiver)._M_base._M_i = true;
      UNLOCK();
    }
    local_458 = (element_type *)0x0;
    a_Stack_450[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_468 = (element_type *)0x0;
    _Stack_460._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    tonk::SDKConnectionList<MyServerConnection>::GetList(&local_440,&this->Server->ConnectionList);
    if (local_440.
        super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_440.
        super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar6 = local_440.
               super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        peVar2 = (psVar6->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        this_00 = &_Stack_460;
        if (((((psVar6->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->IsReceiver)._M_base._M_i & 1U) == 0) {
          if (((peVar2->IsSender)._M_base._M_i & 1U) != 0) {
            local_458 = (psVar6->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr;
            this_00 = a_Stack_450;
            peVar2 = local_468;
            goto LAB_0010386e;
          }
        }
        else {
LAB_0010386e:
          local_468 = peVar2;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_00,&(psVar6->
                              super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                              _M_refcount);
        }
        psVar6 = psVar6 + 1;
      } while (psVar6 != local_440.
                         super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((local_458 != (element_type *)0x0) && (local_468 != (element_type *)0x0)) {
      result = tonk::SDKConnection::P2PConnect
                         (&local_468->super_SDKConnection,&local_458->super_SDKConnection);
      if (result.Result == Tonk_Success) {
        tonk::SDKConnection::GetStatusEx(&local_428,&local_458->super_SDKConnection);
        tonk::SDKConnection::GetStatusEx(&local_a0,&local_458->super_SDKConnection);
        tonk::SDKConnection::GetStatusEx(&local_120,&local_468->super_SDKConnection);
        tonk::SDKConnection::GetStatusEx(&local_1a0,&local_468->super_SDKConnection);
        if ((int)Logger.ChannelMinLevel < 3) {
          poVar1 = (ostringstream *)(local_3a8 + 0x10);
          local_3a8._0_8_ = Logger.ChannelName;
          local_3a8._8_4_ = Info;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"P2P connection started between ",0x1f);
          sVar3 = strlen(local_428.Remote.NetworkString);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_428.Remote.NetworkString,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," <-> ",5);
          sVar3 = strlen(local_120.Remote.NetworkString);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_120.Remote.NetworkString,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," : ",3);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          pOVar4 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_3a8);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base((ios_base *)(local_3a8 + 0x80));
        }
      }
      else {
        pcVar5 = tonk_result_to_string(result.Result);
        std::__cxx11::string::string((string *)&local_428,pcVar5,(allocator *)local_3a8);
        if ((int)Logger.ChannelMinLevel < 4) {
          poVar1 = (ostringstream *)(local_3a8 + 0x10);
          local_3a8._0_8_ = Logger.ChannelName;
          local_3a8._8_4_ = Warning;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"P2P connection failed: ",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,(char *)local_428.ConnectionKey,
                     local_428.Local.NetworkString._0_8_);
          pOVar4 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_3a8);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base((ios_base *)(local_3a8 + 0x80));
        }
        if ((char *)local_428.ConnectionKey != local_428.Local.NetworkString + 8) {
          operator_delete((void *)local_428.ConnectionKey);
        }
      }
    }
    std::
    vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
    ::~vector(&local_440);
    if (_Stack_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_460._M_pi);
    }
    if (a_Stack_450[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_450[0]._M_pi);
    }
  }
  return;
}

Assistant:

void MyServerConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_Reliable0 && bytes == 1)
    {
        auto status = GetStatusEx();

        if (data[0] == 1) {
            Logger.Info("Receiver from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort);
            IsReceiver = true;
        }
        else if (data[0] == 0) {
            Logger.Info("Sender from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort);
            IsSender = true;
        }

        std::shared_ptr<MyServerConnection> sender, receiver;

        auto connections = Server->ConnectionList.GetList();
        for (auto& connection : connections)
        {
            if (connection->IsReceiver) {
                receiver = connection;
            }
            else if (connection->IsSender) {
                sender = connection;
            }
        }

        if (sender && receiver)
        {
            auto result = receiver->P2PConnect(sender.get());

            if (result.Good())
            {
                Logger.Info("P2P connection started between ",
                    sender->GetStatusEx().Remote.NetworkString, " : ",
                    sender->GetStatusEx().Remote.UDPPort, " <-> ",
                    receiver->GetStatusEx().Remote.NetworkString, " : ",
                    receiver->GetStatusEx().Remote.UDPPort);
            }
            else
            {
                Logger.Warning("P2P connection failed: ", result.ToString());
            }
        }
    }
}